

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall
reader_authority_suite::test_userinfo_host_port::test_method(test_userinfo_host_port *this)

{
  bool bVar1;
  uint local_248;
  value local_244;
  view_type local_240;
  undefined8 *local_230;
  char *local_228;
  authority reader;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char input [16];
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_240.ptr_ = input;
  builtin_strncpy(input,"user@1.2.3.4:80",0x10);
  local_240.len_ = strlen(local_240.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_240);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x37);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_244 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_authority>.current_token)
  ;
  local_248 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_240,&local_60,0x37,2,2,&local_244,"reader.code()",&local_248,
             "url::token::code::authority_userinfo");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x38);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
            (&local_240,&local_90,0x38,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","user","\"user\"");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x39);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_1d0 = "";
  bVar1 = trial::url::reader::basic_authority<char>::do_next(&reader);
  local_244 = CONCAT31(local_244._1_3_,bVar1);
  local_248 = CONCAT31(local_248._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_240,&local_1d8,0x39,2,2,&local_244,"reader.next()",&local_248,"true");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x3a);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d8 = "";
  local_244 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_authority>.current_token)
  ;
  local_248 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_240,&local_e0,0x3a,2,2,&local_244,"reader.code()",&local_248,
             "url::token::code::authority_host");
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x3b);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_108 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[8]>
            (&local_240,&local_110,0x3b,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","1.2.3.4","\"1.2.3.4\"");
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x3c);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_1e0 = "";
  bVar1 = trial::url::reader::basic_authority<char>::do_next(&reader);
  local_244 = CONCAT31(local_244._1_3_,bVar1);
  local_248 = CONCAT31(local_248._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_240,&local_1e8,0x3c,2,2,&local_244,"reader.next()",&local_248,"true");
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x3d);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_158 = "";
  local_244 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_authority>.current_token)
  ;
  local_248 = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_240,&local_160,0x3d,2,2,&local_244,"reader.code()",&local_248,
             "url::token::code::authority_port");
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x3e);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_188 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[3]>
            (&local_240,&local_190,0x3e,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","80","\"80\"");
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_198 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x3f);
  local_240.len_ = local_240.len_ & 0xffffffffffffff00;
  local_240.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_1f0 = "";
  bVar1 = trial::url::reader::basic_authority<char>::do_next(&reader);
  local_244 = CONCAT31(local_244._1_3_,bVar1);
  local_248 = local_248 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_240,&local_1f8,0x3f,2,2,&local_244,"reader.next()",&local_248,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_userinfo_host_port)
{
    const char input[] = "user@1.2.3.4:80";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_userinfo);
    BOOST_REQUIRE_EQUAL(reader.literal(), "user");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_host);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1.2.3.4");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_port);
    BOOST_REQUIRE_EQUAL(reader.literal(), "80");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}